

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

void lws_set_timeout_us(lws *wsi,pending_timeout reason,lws_usec_t us)

{
  char cVar1;
  lws_context *plVar2;
  lws_context_per_thread *pt;
  lws_usec_t us_local;
  pending_timeout reason_local;
  lws *wsi_local;
  
  plVar2 = wsi->context;
  cVar1 = wsi->tsi;
  lws_dll2_remove(&(wsi->sul_timeout).list);
  if (us != 0) {
    __lws_sul_insert(&plVar2->pt[(int)cVar1].pt_sul_owner,&wsi->sul_timeout,us);
    _lws_log(4,"%s: %p: %llu us, reason %d\n","lws_set_timeout_us",wsi,us,(ulong)reason);
    wsi->pending_timeout = (char)reason;
  }
  return;
}

Assistant:

void
lws_set_timeout_us(struct lws *wsi, enum pending_timeout reason, lws_usec_t us)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];

	lws_pt_lock(pt, __func__);
	lws_dll2_remove(&wsi->sul_timeout.list);
	lws_pt_unlock(pt);

	if (!us)
		return;

	lws_pt_lock(pt, __func__);
	__lws_sul_insert(&pt->pt_sul_owner, &wsi->sul_timeout, us);

	lwsl_notice("%s: %p: %llu us, reason %d\n", __func__, wsi,
		   (unsigned long long)us, reason);

	wsi->pending_timeout = reason;
	lws_pt_unlock(pt);
}